

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_conn.c
# Opt level: O0

csp_conn_t * csp_conn_allocate(csp_conn_type_t type)

{
  uint uVar1;
  bool bVar2;
  int expected;
  int j;
  int i;
  csp_conn_t *conn;
  csp_conn_type_t type_local;
  csp_conn_t *local_8;
  
  conn = (csp_conn_t *)0x0;
  i = (int)csp_conn_allocate::csp_conn_last_given;
  j = 0;
  do {
    if (7 < j) {
LAB_001079d2:
      if (conn == (csp_conn_t *)0x0) {
        csp_dbg_conn_out = csp_dbg_conn_out + '\x01';
        local_8 = (csp_conn_t *)0x0;
      }
      else {
        conn->timestamp = 0;
        LOCK();
        conn->type = type;
        UNLOCK();
        (conn->idin).flags = '\0';
        (conn->idout).flags = '\0';
        local_8 = conn;
      }
      return local_8;
    }
    uVar1 = i + 1U;
    if ((int)(i + 1U) < 0) {
      uVar1 = i + 8;
    }
    i = (i + 1) - (uVar1 & 0xfffffff8);
    LOCK();
    bVar2 = arr_conn[i].state == 0;
    if (bVar2) {
      arr_conn[i].state = 1;
    }
    UNLOCK();
    if (bVar2) {
      conn = arr_conn + i;
      csp_conn_allocate::csp_conn_last_given = (uint8_t)i;
      goto LAB_001079d2;
    }
    j = j + 1;
  } while( true );
}

Assistant:

csp_conn_t * csp_conn_allocate(csp_conn_type_t type) {

	static uint8_t csp_conn_last_given = 0;

	/* Search for free connection */
	csp_conn_t * conn = NULL;
	int i = csp_conn_last_given;
	for (int j = 0; j < CSP_CONN_MAX; j++) {
		i = (i + 1) % CSP_CONN_MAX;

		int expected = CONN_CLOSED;
		if (atomic_compare_exchange_strong(&arr_conn[i].state, &expected, CONN_OPEN)) {
			conn = &arr_conn[i];
			csp_conn_last_given = i;
			break;
		}
	}

	if (conn == NULL) {
		csp_dbg_conn_out++;
		return NULL;
	}

	conn->timestamp = 0;
	conn->type = type;
	conn->idin.flags = 0;
	conn->idout.flags = 0;
	return conn;
}